

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O3

void __thiscall test_butter::test_method(test_butter *this)

{
  long lVar1;
  check_is_close_t local_301;
  double ***local_300;
  double ****local_2f8;
  double **local_2f0;
  double ****local_2e8;
  char *local_2e0;
  undefined **local_2d8;
  ulong local_2d0;
  shared_count sStack_2c8;
  char *local_2c0;
  undefined **local_2b8;
  undefined1 local_2b0;
  undefined8 *local_2a8;
  double *****local_2a0;
  double ****local_298;
  assertion_result local_290;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  double ***local_260;
  double local_258;
  double actual_gain;
  double expected_gain;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_240;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  array<double,_7UL> actual_a;
  array<double,_7UL> actual_b;
  array<double,_7UL> expected_a;
  array<double,_7UL> expected_b;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  expected_gain = 2.18780328998614e-06;
  expected_b._M_elems[4] = 15.0;
  expected_b._M_elems[5] = 6.0;
  expected_b._M_elems[2] = 15.0;
  expected_b._M_elems[3] = 20.0;
  expected_b._M_elems[0] = 1.0;
  expected_b._M_elems[1] = 6.0;
  expected_b._M_elems[6] = 1.0;
  expected_a._M_elems[4] = 7.801326239249508;
  expected_a._M_elems[5] = -2.683448745937741;
  expected_a._M_elems[2] = 10.699633740567215;
  expected_a._M_elems[3] = -12.151435255115082;
  expected_a._M_elems[0] = 1.0;
  expected_a._M_elems[1] = -5.052163948341672;
  expected_a._M_elems[6] = 0.38622798898833;
  butter_lp<6>(&local_240,2048000.0,80000.0);
  local_258 = local_240.
              super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
              super__Head_base<0UL,_double,_false>._M_head_impl;
  actual_gain = local_240.
                super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
                super__Head_base<0UL,_double,_false>._M_head_impl;
  actual_b._M_elems[0] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0];
  actual_b._M_elems[1] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1];
  actual_b._M_elems[2] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2];
  actual_b._M_elems[3] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3];
  actual_b._M_elems[4] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[4];
  actual_b._M_elems[5] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[5];
  actual_b._M_elems[6] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[6];
  actual_a._M_elems[0]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0]._0_4_;
  actual_a._M_elems[0]._4_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0]._4_4_;
  actual_a._M_elems[1]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_;
  actual_a._M_elems[1]._4_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._4_4_;
  actual_a._M_elems[2]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2]._0_4_;
  actual_a._M_elems[2]._4_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2]._4_4_;
  actual_a._M_elems[3]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3]._0_4_;
  actual_a._M_elems[3]._4_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3]._4_4_;
  actual_a._M_elems[4]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[4]._0_4_;
  actual_a._M_elems[4]._4_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[4]._4_4_;
  actual_a._M_elems[5]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[5]._0_4_;
  actual_a._M_elems[5]._4_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[5]._4_4_;
  actual_a._M_elems[6] =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[6];
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x27);
  local_2d0 = local_2d0 & 0xffffffffffffff00;
  local_2d8 = &PTR__lazy_ostream_00113a38;
  sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  local_2f0 = (double **)0x3d719799812dea11;
  boost::test_tools::check_is_close_t::operator()
            (&local_290,&local_301,2.18780328998614e-06,local_258,
             (percent_tolerance_t<double>)0x3d719799812dea11);
  local_2e8 = (double ****)0x10f22f;
  local_2e0 = "";
  local_298 = (double ****)&expected_gain;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
       0xffffff00;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
       (double)&PTR__lazy_ostream_00113af8;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
       (double)&boost::unit_test::lazy_ostream::inst;
  local_2f8 = (double ****)&actual_gain;
  local_2a0 = &local_2f8;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00113af8;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_2f0;
  local_260 = (double ***)&local_300;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_00113b38;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
       (double)&local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_2d8,&local_2e8,0x27,1,8,3,"expected_gain",&local_240,"actual_gain",
             &local_2b8,"::boost::math::fpc::percent_tolerance(1e-12)",&local_278);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x28);
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_00113a38;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = (double ***)0x10f946;
  local_2f8 = (double ****)0x7;
  local_300 = (double ***)0x7;
  local_2d8 = (undefined **)CONCAT71(local_2d8._1_7_,1);
  local_2d0 = 0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_290.m_message.px = (element_type *)0x10f286;
  local_2e8 = (double ****)&local_2f8;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
       0xffffff00;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
       (double)&PTR__lazy_ostream_00113b78;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
       (double)&boost::unit_test::lazy_ostream::inst;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
       (double)&local_2e8;
  local_298 = &local_300;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00113b78;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_2d8,&local_278,&local_290,0x28,2,2,2,"distance(a, ae)",&local_240,
             "distance(b, end(actual_b))",&local_2b8);
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  lVar1 = 0;
  do {
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x28,&local_1a8);
    local_2d0 = local_2d0 & 0xffffffffffffff00;
    local_2d8 = &PTR__lazy_ostream_00113a38;
    sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    local_2f0 = (double **)0x3d719799812dea11;
    boost::test_tools::check_is_close_t::operator()
              (&local_290,&local_301,*(double *)((long)expected_b._M_elems + lVar1),
               *(double *)((long)actual_b._M_elems + lVar1),
               (percent_tolerance_t<double>)0x3d719799812dea11);
    local_2f8 = (double ****)((long)actual_b._M_elems + lVar1);
    local_298 = (double ****)((long)expected_b._M_elems + lVar1);
    local_2e8 = (double ****)0x10f22f;
    local_2e0 = "";
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
         local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>
         .super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
         super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
         super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
         0xffffff00;
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
         (double)&PTR__lazy_ostream_00113af8;
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
         (double)&boost::unit_test::lazy_ostream::inst;
    local_2b0 = 0;
    local_2b8 = &PTR__lazy_ostream_00113af8;
    local_2a8 = &boost::unit_test::lazy_ostream::inst;
    local_2a0 = &local_2f8;
    local_300 = &local_2f0;
    local_270 = 0;
    local_278 = &PTR__lazy_ostream_00113b38;
    local_268 = &boost::unit_test::lazy_ostream::inst;
    local_260 = (double ***)&local_300;
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
         (double)&local_298;
    boost::test_tools::tt_detail::report_assertion
              (&local_290,&local_2d8,&local_2e8,0x28,1,8,3,"*a",&local_240,"*b",&local_2b8,
               "::boost::math::fpc::percent_tolerance(1e-12)",&local_278);
    boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x38);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_78 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x29);
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_00113a38;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = (double ***)0x10f946;
  local_2f8 = (double ****)0x7;
  local_300 = (double ***)0x7;
  local_2d8 = (undefined **)CONCAT71(local_2d8._1_7_,1);
  local_2d0 = 0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_290.m_message.px = (element_type *)0x10f286;
  local_2e8 = (double ****)&local_2f8;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
       local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
       0xffffff00;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
       (double)&PTR__lazy_ostream_00113b78;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
       (double)&boost::unit_test::lazy_ostream::inst;
  local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
       (double)&local_2e8;
  local_298 = &local_300;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00113b78;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_298;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  lVar1 = 0;
  do {
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_1b0 = "";
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x29,&local_1c8);
    local_2d0 = local_2d0 & 0xffffffffffffff00;
    local_2d8 = &PTR__lazy_ostream_00113a38;
    sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    local_2f0 = (double **)0x3d719799812dea11;
    boost::test_tools::check_is_close_t::operator()
              (&local_290,&local_301,*(double *)((long)expected_a._M_elems + lVar1),
               *(double *)((long)actual_a._M_elems + lVar1),
               (percent_tolerance_t<double>)0x3d719799812dea11);
    local_2f8 = (double ****)((long)actual_a._M_elems + lVar1);
    local_298 = (double ****)((long)expected_a._M_elems + lVar1);
    local_2e8 = (double ****)0x10f22f;
    local_2e0 = "";
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
         local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>
         .super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
         super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
         super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
         0xffffff00;
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
         (double)&PTR__lazy_ostream_00113af8;
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
         (double)&boost::unit_test::lazy_ostream::inst;
    local_2b0 = 0;
    local_2b8 = &PTR__lazy_ostream_00113af8;
    local_2a8 = &boost::unit_test::lazy_ostream::inst;
    local_2a0 = &local_2f8;
    local_300 = &local_2f0;
    local_270 = 0;
    local_278 = &PTR__lazy_ostream_00113b38;
    local_268 = &boost::unit_test::lazy_ostream::inst;
    local_260 = (double ***)&local_300;
    local_240.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
         (double)&local_298;
    boost::test_tools::tt_detail::report_assertion
              (&local_290,&local_2d8,&local_2e8,0x29,1,8,3,"*a",&local_240,"*b",&local_2b8,
               "::boost::math::fpc::percent_tolerance(1e-12)",&local_278);
    boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x38);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_butter)
{
    // generated with octave signal package
    // > pkg load signal
    // > [b,a] = butter(6, 2*80000/2048000)
    double expected_gain = 2.18780328998614e-06;
    std::array<double, 7> expected_b({ 1, 6, 15, 20, 15, 6, 1 });
    std::array<double, 7> expected_a(
      { 1, -5.052163948341672, 10.699633740567215, -12.151435255115082,
        7.801326239249508, -2.683448745937741, 0.386227988988330 });

    double actual_gain;
    std::array<double, 7 > actual_b;
    std::array<double, 7 > actual_a;

    std::tie(actual_gain, actual_b, actual_a) = butter_lp<6>(2048000, 80000);

    BOOST_CHECK_CLOSE(expected_gain, actual_gain, 1e-12);
    CHECK_CLOSE_COLLECTION(expected_b, actual_b, 1e-12);
    CHECK_CLOSE_COLLECTION(expected_a, actual_a, 1e-12);
}